

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

void set_default_term(course_query *query)

{
  uint uVar1;
  tm *ptVar2;
  time_t now;
  time_t local_10;
  
  local_10 = time((time_t *)0x0);
  ptVar2 = localtime(&local_10);
  query->year = (unsigned_short)ptVar2->tm_year;
  uVar1 = ptVar2->tm_mon - 1;
  if (uVar1 < 0xc) {
    query->quarter = *(quarter *)(&DAT_0010a360 + (ulong)uVar1 * 4);
  }
  return;
}

Assistant:

void set_default_term(struct course_query *query)
{
	time_t now = time(NULL);
	struct tm *tm = localtime(&now);

	query->year = tm->tm_year;
	switch (tm->tm_mon) {
	case 6:
	case 7:
	case 8:
		/* Summer - June to August */
		query->quarter = SUMMER_QUARTER;
		break;
	case 9:
	case 10:
	case 11:
		/* Fall - September to November */
		query->quarter = FALL_QUARTER;
		break;
	case 12:
	case 1:
	case 2:
		/* Winter - December to February */
		query->quarter = WINTER_QUARTER;
		break;
	case 3:
	case 4:
	case 5:
		/* Spring - March to May */
		query->quarter = SPRING_QUARTER;
	}
}